

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O0

void secp256k1_scalar_mul_512(uint64_t *l,secp256k1_scalar *a,secp256k1_scalar *b)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  uint64_t *pb;
  secp256k1_scalar *b_local;
  secp256k1_scalar *a_local;
  uint64_t *l_local;
  
  uVar41 = a->d[0];
  uVar42 = a->d[1];
  uVar1 = a->d[2];
  uVar43 = b->d[0];
  uVar2 = b->d[1];
  uVar44 = b->d[2];
  uVar3 = b->d[3];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar41;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar43;
  uVar45 = SUB168(auVar4 * auVar20,8);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar45;
  *l = SUB168(auVar4 * auVar20,0);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar41;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar2;
  auVar5 = auVar5 * auVar21;
  uVar49 = SUB168(auVar5 + auVar37,0);
  uVar52 = SUB168(auVar5 + auVar37,8);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar42;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar43;
  uVar46 = SUB168(auVar6 * auVar22,8);
  uVar38 = SUB168(auVar6 * auVar22,0);
  uVar39 = (ulong)CARRY8(uVar49,uVar38);
  uVar40 = uVar52 + uVar46;
  uVar53 = uVar40 + uVar39;
  uVar55 = (ulong)CARRY8(auVar5._8_8_,(ulong)CARRY8(uVar45,auVar5._0_8_)) +
           (ulong)(CARRY8(uVar52,uVar46) || CARRY8(uVar40,uVar39));
  l[1] = uVar49 + uVar38;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar41;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar44;
  uVar47 = SUB168(auVar7 * auVar23,8);
  uVar39 = SUB168(auVar7 * auVar23,0);
  uVar38 = uVar53 + uVar39;
  uVar39 = (ulong)CARRY8(uVar53,uVar39);
  uVar45 = uVar55 + uVar47;
  uVar56 = uVar45 + uVar39;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar42;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar2;
  uVar53 = SUB168(auVar8 * auVar24,8);
  uVar40 = SUB168(auVar8 * auVar24,0);
  uVar54 = uVar38 + uVar40;
  uVar40 = (ulong)CARRY8(uVar38,uVar40);
  uVar46 = uVar56 + uVar53;
  uVar57 = uVar46 + uVar40;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar1;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar43;
  uVar48 = SUB168(auVar9 * auVar25,8);
  uVar52 = SUB168(auVar9 * auVar25,0);
  uVar38 = (ulong)CARRY8(uVar54,uVar52);
  uVar49 = uVar57 + uVar48;
  uVar58 = uVar49 + uVar38;
  uVar56 = (ulong)(CARRY8(uVar55,uVar47) || CARRY8(uVar45,uVar39)) +
           (ulong)(CARRY8(uVar56,uVar53) || CARRY8(uVar46,uVar40)) +
           (ulong)(CARRY8(uVar57,uVar48) || CARRY8(uVar49,uVar38));
  l[2] = uVar54 + uVar52;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar41;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar3;
  uVar53 = SUB168(auVar10 * auVar26,8);
  uVar41 = SUB168(auVar10 * auVar26,0);
  uVar38 = uVar58 + uVar41;
  uVar39 = (ulong)CARRY8(uVar58,uVar41);
  uVar45 = uVar56 + uVar53;
  uVar57 = uVar45 + uVar39;
  uVar41 = a->d[3];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar42;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar44;
  uVar48 = SUB168(auVar11 * auVar27,8);
  uVar40 = SUB168(auVar11 * auVar27,0);
  uVar49 = uVar38 + uVar40;
  uVar40 = (ulong)CARRY8(uVar38,uVar40);
  uVar46 = uVar57 + uVar48;
  uVar58 = uVar46 + uVar40;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar1;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar2;
  uVar54 = SUB168(auVar12 * auVar28,8);
  uVar38 = SUB168(auVar12 * auVar28,0);
  uVar59 = uVar49 + uVar38;
  uVar38 = (ulong)CARRY8(uVar49,uVar38);
  uVar49 = uVar58 + uVar54;
  uVar50 = uVar49 + uVar38;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar41;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar43;
  uVar55 = SUB168(auVar13 * auVar29,8);
  uVar47 = SUB168(auVar13 * auVar29,0);
  uVar43 = (ulong)CARRY8(uVar59,uVar47);
  uVar52 = uVar50 + uVar55;
  uVar51 = uVar52 + uVar43;
  uVar53 = (ulong)(CARRY8(uVar56,uVar53) || CARRY8(uVar45,uVar39)) +
           (ulong)(CARRY8(uVar57,uVar48) || CARRY8(uVar46,uVar40)) +
           (ulong)(CARRY8(uVar58,uVar54) || CARRY8(uVar49,uVar38)) +
           (ulong)(CARRY8(uVar50,uVar55) || CARRY8(uVar52,uVar43));
  l[3] = uVar59 + uVar47;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar42;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar3;
  uVar46 = SUB168(auVar14 * auVar30,8);
  uVar42 = SUB168(auVar14 * auVar30,0);
  uVar40 = uVar51 + uVar42;
  uVar42 = (ulong)CARRY8(uVar51,uVar42);
  uVar39 = uVar53 + uVar46;
  uVar48 = uVar39 + uVar42;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar1;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar44;
  uVar49 = SUB168(auVar15 * auVar31,8);
  uVar43 = SUB168(auVar15 * auVar31,0);
  uVar47 = uVar40 + uVar43;
  uVar43 = (ulong)CARRY8(uVar40,uVar43);
  uVar40 = uVar48 + uVar49;
  uVar54 = uVar40 + uVar43;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar41;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar2;
  uVar52 = SUB168(auVar16 * auVar32,8);
  uVar45 = SUB168(auVar16 * auVar32,0);
  uVar2 = (ulong)CARRY8(uVar47,uVar45);
  uVar38 = uVar54 + uVar52;
  uVar55 = uVar38 + uVar2;
  uVar46 = (ulong)(CARRY8(uVar53,uVar46) || CARRY8(uVar39,uVar42)) +
           (ulong)(CARRY8(uVar48,uVar49) || CARRY8(uVar40,uVar43)) +
           (ulong)(CARRY8(uVar54,uVar52) || CARRY8(uVar38,uVar2));
  l[4] = uVar47 + uVar45;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar1;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar3;
  uVar39 = SUB168(auVar17 * auVar33,8);
  uVar42 = SUB168(auVar17 * auVar33,0);
  uVar38 = uVar55 + uVar42;
  uVar42 = (ulong)CARRY8(uVar55,uVar42);
  uVar43 = uVar46 + uVar39;
  uVar45 = uVar43 + uVar42;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar41;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar44;
  uVar40 = SUB168(auVar18 * auVar34,8);
  uVar44 = SUB168(auVar18 * auVar34,0);
  uVar1 = (ulong)CARRY8(uVar38,uVar44);
  uVar2 = uVar45 + uVar40;
  auVar36._8_8_ =
       (ulong)(CARRY8(uVar46,uVar39) || CARRY8(uVar43,uVar42)) +
       (ulong)(CARRY8(uVar45,uVar40) || CARRY8(uVar2,uVar1));
  auVar36._0_8_ = uVar2 + uVar1;
  l[5] = uVar38 + uVar44;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar41;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar3;
  *(undefined1 (*) [16])(l + 6) = auVar19 * auVar35 + auVar36;
  return;
}

Assistant:

static void secp256k1_scalar_mul_512(uint64_t l[8], const secp256k1_scalar *a, const secp256k1_scalar *b) {
#ifdef USE_ASM_X86_64
    const uint64_t *pb = b->d;
    __asm__ __volatile__(
    /* Preload */
    "movq 0(%%rdi), %%r15\n"
    "movq 8(%%rdi), %%rbx\n"
    "movq 16(%%rdi), %%rcx\n"
    "movq 0(%%rdx), %%r11\n"
    "movq 8(%%rdx), %%r12\n"
    "movq 16(%%rdx), %%r13\n"
    "movq 24(%%rdx), %%r14\n"
    /* (rax,rdx) = a0 * b0 */
    "movq %%r15, %%rax\n"
    "mulq %%r11\n"
    /* Extract l0 */
    "movq %%rax, 0(%%rsi)\n"
    /* (r8,r9,r10) = (rdx) */
    "movq %%rdx, %%r8\n"
    "xorq %%r9, %%r9\n"
    "xorq %%r10, %%r10\n"
    /* (r8,r9,r10) += a0 * b1 */
    "movq %%r15, %%rax\n"
    "mulq %%r12\n"
    "addq %%rax, %%r8\n"
    "adcq %%rdx, %%r9\n"
    "adcq $0, %%r10\n"
    /* (r8,r9,r10) += a1 * b0 */
    "movq %%rbx, %%rax\n"
    "mulq %%r11\n"
    "addq %%rax, %%r8\n"
    "adcq %%rdx, %%r9\n"
    "adcq $0, %%r10\n"
    /* Extract l1 */
    "movq %%r8, 8(%%rsi)\n"
    "xorq %%r8, %%r8\n"
    /* (r9,r10,r8) += a0 * b2 */
    "movq %%r15, %%rax\n"
    "mulq %%r13\n"
    "addq %%rax, %%r9\n"
    "adcq %%rdx, %%r10\n"
    "adcq $0, %%r8\n"
    /* (r9,r10,r8) += a1 * b1 */
    "movq %%rbx, %%rax\n"
    "mulq %%r12\n"
    "addq %%rax, %%r9\n"
    "adcq %%rdx, %%r10\n"
    "adcq $0, %%r8\n"
    /* (r9,r10,r8) += a2 * b0 */
    "movq %%rcx, %%rax\n"
    "mulq %%r11\n"
    "addq %%rax, %%r9\n"
    "adcq %%rdx, %%r10\n"
    "adcq $0, %%r8\n"
    /* Extract l2 */
    "movq %%r9, 16(%%rsi)\n"
    "xorq %%r9, %%r9\n"
    /* (r10,r8,r9) += a0 * b3 */
    "movq %%r15, %%rax\n"
    "mulq %%r14\n"
    "addq %%rax, %%r10\n"
    "adcq %%rdx, %%r8\n"
    "adcq $0, %%r9\n"
    /* Preload a3 */
    "movq 24(%%rdi), %%r15\n"
    /* (r10,r8,r9) += a1 * b2 */
    "movq %%rbx, %%rax\n"
    "mulq %%r13\n"
    "addq %%rax, %%r10\n"
    "adcq %%rdx, %%r8\n"
    "adcq $0, %%r9\n"
    /* (r10,r8,r9) += a2 * b1 */
    "movq %%rcx, %%rax\n"
    "mulq %%r12\n"
    "addq %%rax, %%r10\n"
    "adcq %%rdx, %%r8\n"
    "adcq $0, %%r9\n"
    /* (r10,r8,r9) += a3 * b0 */
    "movq %%r15, %%rax\n"
    "mulq %%r11\n"
    "addq %%rax, %%r10\n"
    "adcq %%rdx, %%r8\n"
    "adcq $0, %%r9\n"
    /* Extract l3 */
    "movq %%r10, 24(%%rsi)\n"
    "xorq %%r10, %%r10\n"
    /* (r8,r9,r10) += a1 * b3 */
    "movq %%rbx, %%rax\n"
    "mulq %%r14\n"
    "addq %%rax, %%r8\n"
    "adcq %%rdx, %%r9\n"
    "adcq $0, %%r10\n"
    /* (r8,r9,r10) += a2 * b2 */
    "movq %%rcx, %%rax\n"
    "mulq %%r13\n"
    "addq %%rax, %%r8\n"
    "adcq %%rdx, %%r9\n"
    "adcq $0, %%r10\n"
    /* (r8,r9,r10) += a3 * b1 */
    "movq %%r15, %%rax\n"
    "mulq %%r12\n"
    "addq %%rax, %%r8\n"
    "adcq %%rdx, %%r9\n"
    "adcq $0, %%r10\n"
    /* Extract l4 */
    "movq %%r8, 32(%%rsi)\n"
    "xorq %%r8, %%r8\n"
    /* (r9,r10,r8) += a2 * b3 */
    "movq %%rcx, %%rax\n"
    "mulq %%r14\n"
    "addq %%rax, %%r9\n"
    "adcq %%rdx, %%r10\n"
    "adcq $0, %%r8\n"
    /* (r9,r10,r8) += a3 * b2 */
    "movq %%r15, %%rax\n"
    "mulq %%r13\n"
    "addq %%rax, %%r9\n"
    "adcq %%rdx, %%r10\n"
    "adcq $0, %%r8\n"
    /* Extract l5 */
    "movq %%r9, 40(%%rsi)\n"
    /* (r10,r8) += a3 * b3 */
    "movq %%r15, %%rax\n"
    "mulq %%r14\n"
    "addq %%rax, %%r10\n"
    "adcq %%rdx, %%r8\n"
    /* Extract l6 */
    "movq %%r10, 48(%%rsi)\n"
    /* Extract l7 */
    "movq %%r8, 56(%%rsi)\n"
    : "+d"(pb)
    : "S"(l), "D"(a->d)
    : "rax", "rbx", "rcx", "r8", "r9", "r10", "r11", "r12", "r13", "r14", "r15", "cc", "memory");
#else
    /* 160 bit accumulator. */
    uint64_t c0 = 0, c1 = 0;
    uint32_t c2 = 0;

    /* l[0..7] = a[0..3] * b[0..3]. */
    muladd_fast(a->d[0], b->d[0]);
    extract_fast(l[0]);
    muladd(a->d[0], b->d[1]);
    muladd(a->d[1], b->d[0]);
    extract(l[1]);
    muladd(a->d[0], b->d[2]);
    muladd(a->d[1], b->d[1]);
    muladd(a->d[2], b->d[0]);
    extract(l[2]);
    muladd(a->d[0], b->d[3]);
    muladd(a->d[1], b->d[2]);
    muladd(a->d[2], b->d[1]);
    muladd(a->d[3], b->d[0]);
    extract(l[3]);
    muladd(a->d[1], b->d[3]);
    muladd(a->d[2], b->d[2]);
    muladd(a->d[3], b->d[1]);
    extract(l[4]);
    muladd(a->d[2], b->d[3]);
    muladd(a->d[3], b->d[2]);
    extract(l[5]);
    muladd_fast(a->d[3], b->d[3]);
    extract_fast(l[6]);
    VERIFY_CHECK(c1 == 0);
    l[7] = c0;
#endif
}